

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void FinalizeAlloca(ExpressionContext *ctx,VmModule *module,VariableData *variable)

{
  SmallArray<VariableData_*,_4U> *this;
  TypeBase *pTVar1;
  FunctionData *pFVar2;
  VariableData **ppVVar3;
  uint uVar4;
  long lVar5;
  char *__function;
  longlong *plVar6;
  ScopeData *pSVar7;
  
  pTVar1 = variable->type;
  pFVar2 = module->currentFunction->function;
  if (pFVar2 == (FunctionData *)0x0) {
    pSVar7 = ctx->globalScope;
    plVar6 = &pSVar7->dataSize;
  }
  else {
    pSVar7 = pFVar2->functionScope;
    plVar6 = &pFVar2->stackSize;
  }
  uVar4 = GetAlignmentOffset(*plVar6,pTVar1->alignment);
  lVar5 = (ulong)uVar4 + *plVar6;
  *plVar6 = lVar5;
  *plVar6 = pTVar1->size + lVar5;
  if (pSVar7 == (ScopeData *)0x0) {
    __assert_fail("scope",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x3be,
                  "ScopeData *(anonymous namespace)::AllocateScopeSlot(ExpressionContext &, VmModule *, TypeBase *, unsigned int &)"
                 );
  }
  variable->offset = (uint)lVar5;
  this = &pSVar7->allVariables;
  uVar4 = (pSVar7->allVariables).count;
  if (uVar4 != 0) {
    lVar5 = 0;
    do {
      if (this->data[lVar5] == variable) {
        return;
      }
      lVar5 = lVar5 + 1;
    } while (uVar4 != (uint)lVar5);
  }
  if (variable->isVmAlloca == false) {
    __assert_fail("variable->isVmAlloca",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x9cb,"void FinalizeAlloca(ExpressionContext &, VmModule *, VariableData *)");
  }
  uVar4 = (pSVar7->variables).count;
  if (uVar4 == (pSVar7->variables).max) {
    SmallArray<VariableData_*,_4U>::grow(&pSVar7->variables,uVar4);
  }
  ppVVar3 = (pSVar7->variables).data;
  if (ppVVar3 != (VariableData **)0x0) {
    uVar4 = (pSVar7->variables).count;
    (pSVar7->variables).count = uVar4 + 1;
    ppVVar3[uVar4] = variable;
    uVar4 = (pSVar7->allVariables).count;
    if (uVar4 == (pSVar7->allVariables).max) {
      SmallArray<VariableData_*,_4U>::grow(this,uVar4);
    }
    if (this->data != (VariableData **)0x0) {
      uVar4 = (pSVar7->allVariables).count;
      (pSVar7->allVariables).count = uVar4 + 1;
      this->data[uVar4] = variable;
      uVar4 = (ctx->variables).count;
      if (uVar4 == (ctx->variables).max) {
        SmallArray<VariableData_*,_128U>::grow(&ctx->variables,uVar4);
      }
      ppVVar3 = (ctx->variables).data;
      if (ppVVar3 != (VariableData **)0x0) {
        uVar4 = (ctx->variables).count;
        (ctx->variables).count = uVar4 + 1;
        ppVVar3[uVar4] = variable;
        return;
      }
      __function = 
      "void SmallArray<VariableData *, 128>::push_back(const T &) [T = VariableData *, N = 128]";
      goto LAB_0027ee4a;
    }
  }
  __function = 
  "void SmallArray<VariableData *, 4>::push_back(const T &) [T = VariableData *, N = 4]";
LAB_0027ee4a:
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,__function);
}

Assistant:

void FinalizeAlloca(ExpressionContext &ctx, VmModule *module, VariableData *variable)
{
	unsigned offset = 0;
	ScopeData *scope = AllocateScopeSlot(ctx, module, variable->type, offset);

	variable->offset = offset;

	bool found = false;

	for(unsigned i = 0, e = scope->allVariables.size(); i < e; i++)
	{
		if(scope->allVariables.data[i] == variable)
		{
			found = true;
			break;
		}
	}

	if(!found)
	{
		assert(variable->isVmAlloca);

		scope->variables.push_back(variable);
		scope->allVariables.push_back(variable);
		ctx.variables.push_back(variable);
	}
}